

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O3

void CVmObjBigNum::compute_sum_into(char *new_ext,char *ext1,char *ext2)

{
  char *ext2_00;
  
  if ((ext1[4] & 1U) != (ext2[4] & 1U)) {
    ext2_00 = ext1;
    if ((ext1[4] & 1U) == 0) {
      ext2_00 = ext2;
      ext2 = ext1;
    }
    compute_abs_diff_into(new_ext,ext2,ext2_00);
    return;
  }
  compute_abs_sum_into(new_ext,ext1,ext2);
  new_ext[4] = new_ext[4] & 0xfeU | ext1[4] & 1U;
  return;
}

Assistant:

void CVmObjBigNum::compute_sum_into(char *new_ext,
                                    const char *ext1, const char *ext2)
{
    /* check to see if the numbers have the same sign */
    if (get_neg(ext1) == get_neg(ext2))
    {
        /*
         *   the two numbers have the same sign, so the sum has the same sign
         *   as the two values, and the magnitude is the sum of the absolute
         *   values of the operands
         */

        /* compute the sum of the absolute values */
        compute_abs_sum_into(new_ext, ext1, ext2);

        /* set the sign to match that of the operand */
        set_neg(new_ext, get_neg(ext1));
    }
    else
    {
        /* 
         *   one is positive and the other is negative - subtract the
         *   absolute value of the negative one from the absolute value of
         *   the positive one; the sign will be set correctly by the
         *   differencing 
         */
        if (get_neg(ext1))
            compute_abs_diff_into(new_ext, ext2, ext1);
        else
            compute_abs_diff_into(new_ext, ext1, ext2);
    }
}